

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void cppcms::json::details::generic_append<cppcms::json::details::stream_append>
               (char *begin,char *end,stream_append *a)

{
  byte bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  size_t sVar4;
  char *__s;
  byte *pbVar5;
  char buf [8];
  char local_3a [2];
  undefined1 local_38 [5];
  char cStack_33;
  undefined1 uStack_31;
  
  local_3a[0] = '\"';
  std::__ostream_insert<char,std::char_traits<char>>(a->out,local_3a,1);
  _local_38 = 0x3030755c;
  pbVar5 = (byte *)begin;
  if (begin != end) {
    do {
      uVar3 = _local_38;
      bVar1 = *pbVar5;
      switch(bVar1) {
      case 8:
        __s = "\\b";
        break;
      case 9:
        __s = "\\t";
        break;
      case 10:
        __s = "\\n";
        break;
      case 0xb:
switchD_0010c05f_caseD_b:
        if (bVar1 < 0x20) {
          uStack_31 = SUB81(uVar3,7);
          _local_38 = (uint7)CONCAT15("0123456789abcdef"[bVar1 & 0xf],
                                      CONCAT14("0123456789abcdef"[bVar1 >> 4],local_38._0_4_));
          __s = local_38;
          break;
        }
        goto LAB_0010c104;
      case 0xc:
        __s = "\\f";
        break;
      case 0xd:
        __s = "\\r";
        break;
      default:
        __s = "\\\"";
        if (bVar1 != 0x22) {
          if (bVar1 != 0x5c) goto switchD_0010c05f_caseD_b;
          __s = "\\\\";
        }
      }
      std::ostream::write((char *)a->out,(long)begin);
      poVar2 = a->out;
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar4);
      begin = (char *)(pbVar5 + 1);
LAB_0010c104:
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != (byte *)end);
  }
  std::ostream::write((char *)a->out,(long)begin);
  local_3a[1] = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(a->out,local_3a + 1,1);
  return;
}

Assistant:

void generic_append(char const *begin,char const *end,Appender &a)
		{
			a.append('"');
			char const *i,*last;
			char buf[8] = "\\u00";
			for(i=begin,last = begin;i!=end;) {
				char const *addon = 0;
				unsigned char c=*i;
				switch(c) {
				case 0x22: addon = "\\\""; break;
				case 0x5C: addon = "\\\\"; break;
				case '\b': addon = "\\b"; break;
				case '\f': addon = "\\f"; break;
				case '\n': addon = "\\n"; break;
				case '\r': addon = "\\r"; break;
				case '\t': addon = "\\t"; break;
				default:
					if(c<=0x1F) {
						static char const tohex[]="0123456789abcdef";
						buf[4]=tohex[c >>  4];
						buf[5]=tohex[c & 0xF];
						buf[6]=0;
						addon = buf;
					}
				};
				if(addon) {
					a.append(last,i-last);
					a.append(addon);
					i++;
					last = i;
				}
				else {
					i++;
				}
			}
			a.append(last,i-last);
			a.append('"');
		}